

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_ptr __thiscall mjs::parser::parse_member_expression(parser *this)

{
  undefined1 auVar1 [8];
  undefined4 uVar2;
  int iVar3;
  char *in_RCX;
  parser *in_RSI;
  undefined8 uVar4;
  bool bVar5;
  wstring_view id_00;
  expression_ptr me;
  wstring id;
  token id_token;
  source_extend id_extend;
  expression_ptr e;
  undefined1 local_110 [8];
  undefined1 local_108 [32];
  undefined1 local_e8 [8];
  undefined1 local_e0 [32];
  undefined1 local_c0 [24];
  undefined1 local_a8 [28];
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_8c;
  anon_union_32_3_e608ca2d_for_token_1 local_80;
  token local_58;
  
  local_110 = (undefined1  [8])0x0;
  iVar3 = (int)in_RSI;
  accept((parser *)local_e0,iVar3,(sockaddr *)0x59,(socklen_t *)in_RCX);
  uVar2 = local_e0._0_4_;
  token::destroy((token *)local_e0);
  if (uVar2 == 0x72) {
    if ((int)in_RSI->version_ < 1) {
      bVar5 = false;
    }
    else {
      accept((parser *)&local_80.text_,iVar3,(sockaddr *)0x4d,(socklen_t *)in_RCX);
      bVar5 = local_80.ivalue_._0_4_ != 0x72;
      token::destroy((token *)&local_80.text_);
    }
    if (bVar5) {
      local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_108._16_4_ = es1;
      local_a8._0_8_ =
           (in_RSI->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_a8._8_8_ =
           (in_RSI->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        in_RCX = &__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
        }
      }
      local_a8._16_4_ = in_RSI->token_start_;
      local_a8._20_4_ = (undefined4)(in_RSI->lexer_).text_pos_;
      local_108._0_8_ = (expression *)(local_108 + 0x10);
      accept((parser *)local_e0,iVar3,(sockaddr *)0x2,(socklen_t *)in_RCX);
      if ((local_e0._0_4_ == es5) || (local_e0._0_4_ == 4)) {
        std::__cxx11::wstring::_M_assign((wstring *)local_108);
      }
      else if (local_e0._0_4_ != 0x72) {
        __assert_fail("has_text()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h"
                      ,0xd6,"const std::wstring &mjs::token::text() const");
      }
      token::destroy((token *)local_e0);
      parse_function_abi_cxx11_
                ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                  *)local_e0,in_RSI);
      iVar3 = (*(*(_func_int ***)local_e0._0_8_)[3])();
      if (iVar3 != 0) {
        __assert_fail("block->type() == statement_type::block",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                      ,0x2c3,"expression_ptr mjs::parser::parse_member_expression()");
      }
      if (*(char *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._0_8_ + 0x30))->
                    _M_use_count == '\x01') {
        id_00._M_str = (wchar_t *)local_108._0_8_;
        id_00._M_len = local_108._8_8_;
        check_function_name(in_RSI,id_00,(source_extend *)local_a8);
      }
      make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                (this,(source_extend *)in_RSI,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_c0,(vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                           *)local_108,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)(local_e0 + 8))
      ;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)(local_e0 + 8));
      if ((element_type *)local_e0._0_8_ != (element_type *)0x0) {
        (*(*(_func_int ***)local_e0._0_8_)[1])();
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      if ((expression *)local_108._0_8_ != (expression *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,CONCAT44(local_108._20_4_,local_108._16_4_) * 4 + 4)
        ;
      }
      goto LAB_0018123a;
    }
    parse_primary_expression((parser *)local_e0);
    uVar4 = local_e0._0_8_;
    auVar1 = local_110;
    local_e0._0_8_ = (element_type *)0x0;
    local_110 = (undefined1  [8])uVar4;
    uVar4 = local_e0._0_8_;
    if (auVar1 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auVar1 + 8))();
      uVar4 = local_e0._0_8_;
    }
  }
  else {
    parse_member_expression((parser *)&local_80.text_);
    if ((in_RSI->current_token_).type_ == lparen) {
      parse_argument_list((expression_list *)local_e0,in_RSI);
      make_expression<mjs::call_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                ((parser *)local_108,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)in_RSI,
                 (vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                  *)&local_80.text_);
      uVar4 = local_80.ivalue_;
      local_80.ivalue_ = local_108._0_8_;
      local_108._0_8_ =
           (_Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>)0x0;
      if ((element_type *)uVar4 != (element_type *)0x0) {
        (**(code **)(*(long *)uVar4 + 8))();
      }
      if ((_Head_base<0UL,_mjs::expression_*,_false>)local_108._0_8_ !=
          (_Head_base<0UL,_mjs::expression_*,_false>)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
      local_108._0_8_ = (__uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>)0x0
      ;
      std::
      vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                 *)local_e0);
    }
    local_108._0_4_ = 0x59;
    in_RCX = (char *)&local_80;
    make_expression<mjs::prefix_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)local_e0,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_108);
    uVar4 = local_e0._0_8_;
    auVar1 = local_110;
    local_e0._0_8_ = (element_type *)0x0;
    local_110 = (undefined1  [8])uVar4;
    if (auVar1 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auVar1 + 8))();
    }
    uVar4 = local_80.ivalue_;
    if ((element_type *)local_e0._0_8_ != (element_type *)0x0) {
      (*(*(_func_int ***)local_e0._0_8_)[1])();
      uVar4 = local_80.ivalue_;
    }
  }
  if ((element_type *)uVar4 != (element_type *)0x0) {
    (**(code **)(*(long *)uVar4 + 8))();
  }
  unique0x1000070d = this;
  while( true ) {
    while( true ) {
      accept((parser *)local_e0,iVar3,(sockaddr *)0x32,(socklen_t *)in_RCX);
      uVar2 = local_e0._0_4_;
      token::destroy((token *)local_e0);
      if (uVar2 == 0x72) break;
      parse_expression((parser *)local_e0);
      expect(&local_58,in_RSI,rbracket,"parse_member_expression",0x2ce);
      token::destroy(&local_58);
      local_a8._0_4_ = 0x32;
      in_RCX = local_110;
      make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_108,(token_type *)in_RSI,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_a8,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)in_RCX);
      uVar4 = local_108._0_8_;
      auVar1 = local_110;
      local_108._0_8_ = (element_type *)0x0;
      local_110 = (undefined1  [8])uVar4;
      if (auVar1 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar1 + 8))();
      }
      if ((expression *)local_108._0_8_ != (expression *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
      if ((element_type *)local_e0._0_8_ != (element_type *)0x0) {
        (*(*(_func_int ***)local_e0._0_8_)[1])();
      }
    }
    accept((parser *)local_e0,iVar3,(sockaddr *)0x25,(socklen_t *)in_RCX);
    uVar2 = local_e0._0_4_;
    token::destroy((token *)local_e0);
    if (uVar2 == 0x72) break;
    local_8c._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t
    .super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
    super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl._0_4_ = 0x25;
    get_identifier_name_abi_cxx11_((wstring *)local_108,in_RSI,"parse_member_expression",0x2d1);
    token::token((token *)local_e0,string_literal,(wstring *)local_108);
    make_expression<mjs::literal_expression,mjs::token>((parser *)local_e8,(token *)in_RSI);
    in_RCX = local_110;
    make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)local_a8,(token_type *)in_RSI,&local_8c,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)in_RCX);
    uVar4 = local_a8._0_8_;
    auVar1 = local_110;
    local_a8._0_8_ = (long *)0x0;
    local_110 = (undefined1  [8])uVar4;
    if (auVar1 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auVar1 + 8))();
    }
    if ((long *)local_a8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
    local_a8._0_8_ = (element_type *)0x0;
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
    local_e8 = (undefined1  [8])0x0;
    token::destroy((token *)local_e0);
    if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,CONCAT44(local_108._20_4_,local_108._16_4_) * 4 + 4);
    }
  }
  *(undefined1 (*) [8])stack0xffffffffffffff78 = local_110;
  local_110 = (undefined1  [8])0x0;
  this = (parser *)stack0xffffffffffffff78;
LAB_0018123a:
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_110 + 8))();
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (tuple<mjs::expression_*,_std::default_delete<mjs::expression>_>)this;
}

Assistant:

expression_ptr parse_member_expression() {
        // MemberExpression :
        //  PrimaryExpression
        //  FunctionExpression
        //  MemberExpression [ Expression ]
        //  MemberExpression . Identifier (IdentifierName in ES5+)
        //  new MemberExpression Arguments

        expression_ptr me{};
        if (accept(token_type::new_)) {
            auto e = parse_member_expression();
            if (current_token_type() == token_type::lparen) {
                e = make_expression<call_expression>(std::move(e), parse_argument_list());
            }
            me = make_expression<prefix_expression>(token_type::new_, std::move(e));
        } else if (version_ >= version::es3 && accept(token_type::function_)) {
            std::wstring id{};
            const auto id_extend = current_extend();
            if (auto id_token = accept(token_type::identifier)) {
                id = id_token.text();
            }
            auto [extend, params, block] = parse_function();
            assert(block->type() == statement_type::block);
            if (static_cast<const block_statement&>(*block).strict_mode()) {
                check_function_name(id, id_extend);
            }
            return make_expression<function_expression>(extend, id, std::move(params), std::move(block));
        } else {
            me = parse_primary_expression();
        }
        for (;;) {
            if (accept(token_type::lbracket)) {
                auto e = parse_expression();
                EXPECT(token_type::rbracket);
                me = make_expression<binary_expression>(token_type::lbracket, std::move(me), std::move(e));
            } else if (accept(token_type::dot)) {
                me = make_expression<binary_expression>(token_type::dot, std::move(me), make_expression<literal_expression>(token{token_type::string_literal, get_identifier_name(__func__, __LINE__)}));
            } else {
                return me;
            }
        }
    }